

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O2

BoundLimitNode * __thiscall
duckdb::Binder::BindLimitValue
          (BoundLimitNode *__return_storage_ptr__,Binder *this,OrderBinder *order_binder,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *limit_val,bool is_percentage,bool is_offset)

{
  ClientContext *pCVar1;
  optional_idx error_location;
  bool bVar2;
  int iVar3;
  type pBVar4;
  pointer pPVar5;
  pointer pEVar6;
  type expr;
  Binder *pBVar7;
  int64_t value;
  BinderException *pBVar8;
  OutOfRangeException *this_00;
  BoundLimitNode *__return_storage_ptr___00;
  undefined3 in_register_00000089;
  undefined1 local_190 [16];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  optional_ptr<duckdb::DummyBinding,_true> local_170;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> local_168;
  Binder *local_160;
  Binder *local_158;
  ClientContext *local_150;
  undefined4 local_144;
  Value val;
  shared_ptr<duckdb::Binder,_true> new_binder;
  LogicalType local_f0;
  Value local_d8;
  ExpressionBinder expr_binder;
  
  local_144 = CONCAT31(in_register_00000089,is_offset);
  local_190._8_8_ = __return_storage_ptr__;
  CreateBinder((Binder *)&new_binder,this->context,(optional_ptr<duckdb::Binder,_true>)this,
               REGULAR_BINDER);
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator*(&new_binder);
  ExpressionBinder::ExpressionBinder(&expr_binder,pBVar4,this->context,false);
  local_150 = (ClientContext *)CONCAT71(local_150._1_7_,is_percentage);
  LogicalType::LogicalType(&val.type_,is_percentage * '\t' + BIGINT);
  LogicalType::operator=(&expr_binder.target_type,&val.type_);
  LogicalType::~LogicalType(&val.type_);
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(limit_val);
  (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_158,pPVar5);
  ExpressionBinder::Bind
            ((ExpressionBinder *)local_190,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&expr_binder,(optional_ptr<duckdb::LogicalType,_true>)limit_val,false);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)local_190);
  iVar3 = (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[4])(pEVar6);
  if ((char)iVar3 == '\0') {
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)local_190);
    iVar3 = (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar6);
    if ((char)iVar3 == '\0') {
      pBVar7 = shared_ptr<duckdb::Binder,_true>::operator->(&new_binder);
      if ((pBVar7->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pBVar7->correlated_columns).
          super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
          super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&val,"Correlated columns not supported in LIMIT/OFFSET",
                   (allocator *)&local_d8);
        BinderException::BinderException(pBVar8,(string *)&val);
        __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pBVar4 = shared_ptr<duckdb::Binder,_true>::operator*(&new_binder);
      MoveCorrelatedExpressions(this,pBVar4);
      __return_storage_ptr___00 = (BoundLimitNode *)local_190._8_8_;
      if (is_percentage) {
        local_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._0_8_;
        local_190._0_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
        BoundLimitNode::ExpressionPercentage
                  ((BoundLimitNode *)local_190._8_8_,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_178);
        if ((element_type *)local_178._M_pi != (element_type *)0x0) {
          (*(local_178._M_pi)->_vptr__Sp_counted_base[1])();
        }
        local_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_180._M_head_impl = (Expression *)local_190._0_8_;
        local_190._0_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
        BoundLimitNode::ExpressionValue
                  ((BoundLimitNode *)local_190._8_8_,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_180);
        if (local_180._M_head_impl != (Expression *)0x0) {
          (*((local_180._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_180._M_head_impl = (Expression *)0x0;
      }
    }
    else {
      pCVar1 = this->context;
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_190);
      ExpressionExecutor::EvaluateScalar(&local_d8,pCVar1,expr,false);
      pCVar1 = this->context;
      LogicalType::LogicalType(&local_f0,(char)local_150 * '\t' + BIGINT);
      Value::CastAs(&val,&local_d8,pCVar1,&local_f0,false);
      LogicalType::~LogicalType(&local_f0);
      Value::~Value(&local_d8);
      __return_storage_ptr___00 = (BoundLimitNode *)local_190._8_8_;
      if (is_percentage) {
        if (val.is_null == false) {
          local_150 = (ClientContext *)Value::GetValue<double>(&val);
        }
        else {
          local_150 = (ClientContext *)0x4059000000000000;
        }
        bVar2 = Value::IsNan<double>((double)local_150);
        if ((100.0 < (double)local_150) || (bVar2 || (double)local_150 < 0.0)) {
          this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_d8,"Limit percent out of range, should be between 0% and 100%"
                     ,(allocator *)&local_f0);
          OutOfRangeException::OutOfRangeException(this_00,(string *)&local_d8);
          __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        BoundLimitNode::ConstantPercentage(__return_storage_ptr___00,(double)local_150);
      }
      else {
        if (val.is_null == false) {
          value = Value::GetValue<long>(&val);
          if (value < 0) {
            pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
            pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                 *)local_190);
            error_location.index = (pEVar6->super_BaseExpression).query_location.index;
            ::std::__cxx11::string::string
                      ((string *)&local_d8,"LIMIT/OFFSET cannot be negative",(allocator *)&local_f0)
            ;
            BinderException::BinderException<>(pBVar8,error_location,(string *)&local_d8);
            __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        else {
          value = 0x7fffffffffffffff;
          if ((char)local_144 != '\0') {
            value = 0;
          }
        }
        BoundLimitNode::ConstantValue(__return_storage_ptr___00,value);
      }
      Value::~Value(&val);
    }
  }
  else {
    if ((order_binder->extra_list).ptr ==
        (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
         *)0x0) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&val,"Subquery in LIMIT/OFFSET not supported in set operation",
                 (allocator *)&local_d8);
      BinderException::BinderException(pBVar8,(string *)&val);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_160 = local_158;
    local_158 = (Binder *)0x0;
    OrderBinder::CreateExtraReference
              ((OrderBinder *)&val,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)order_binder);
    if (local_160 != (Binder *)0x0) {
      (*(code *)(((local_160->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    __return_storage_ptr___00 = (BoundLimitNode *)local_190._8_8_;
    local_160 = (Binder *)0x0;
    if (is_percentage) {
      local_168.ptr = (vector<duckdb::DummyBinding,_true> *)val.type_._0_8_;
      val.type_.id_ = INVALID;
      val.type_.physical_type_ = ~INVALID;
      val.type_._2_6_ = 0;
      BoundLimitNode::ExpressionPercentage
                ((BoundLimitNode *)local_190._8_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_168);
      if (local_168.ptr != (vector<duckdb::DummyBinding,_true> *)0x0) {
        (**(code **)&((((local_168.ptr)->
                       super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                       super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Binding).binding_type)();
      }
      local_168.ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
    }
    else {
      local_170.ptr = (DummyBinding *)val.type_._0_8_;
      val.type_.id_ = INVALID;
      val.type_.physical_type_ = ~INVALID;
      val.type_._2_6_ = 0;
      BoundLimitNode::ExpressionValue
                ((BoundLimitNode *)local_190._8_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_170);
      if (local_170.ptr != (DummyBinding *)0x0) {
        (*((local_170.ptr)->super_Binding)._vptr_Binding[1])();
      }
      local_170.ptr = (DummyBinding *)0x0;
    }
    if (val.type_._0_8_ != 0) {
      (**(code **)(*(long *)val.type_._0_8_ + 8))();
    }
  }
  if ((Expression *)local_190._0_8_ != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_190._0_8_ + 8))();
  }
  if (local_158 != (Binder *)0x0) {
    (*(code *)(((local_158->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  ExpressionBinder::~ExpressionBinder(&expr_binder);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr___00;
}

Assistant:

BoundLimitNode Binder::BindLimitValue(OrderBinder &order_binder, unique_ptr<ParsedExpression> limit_val,
                                      bool is_percentage, bool is_offset) {
	auto new_binder = Binder::CreateBinder(context, this);
	ExpressionBinder expr_binder(*new_binder, context);
	auto target_type = is_percentage ? LogicalType::DOUBLE : LogicalType::BIGINT;
	expr_binder.target_type = target_type;
	auto original_limit = limit_val->Copy();
	auto expr = expr_binder.Bind(limit_val);
	if (expr->HasSubquery()) {
		if (!order_binder.HasExtraList()) {
			throw BinderException("Subquery in LIMIT/OFFSET not supported in set operation");
		}
		auto bound_limit = order_binder.CreateExtraReference(std::move(original_limit));
		if (is_percentage) {
			return BoundLimitNode::ExpressionPercentage(std::move(bound_limit));
		} else {
			return BoundLimitNode::ExpressionValue(std::move(bound_limit));
		}
	}
	if (expr->IsFoldable()) {
		//! this is a constant
		auto val = ExpressionExecutor::EvaluateScalar(context, *expr).CastAs(context, target_type);
		if (is_percentage) {
			D_ASSERT(!is_offset);
			double percentage_val;
			if (val.IsNull()) {
				percentage_val = 100.0;
			} else {
				percentage_val = val.GetValue<double>();
			}
			if (Value::IsNan(percentage_val) || percentage_val < 0 || percentage_val > 100) {
				throw OutOfRangeException("Limit percent out of range, should be between 0% and 100%");
			}
			return BoundLimitNode::ConstantPercentage(percentage_val);
		} else {
			int64_t constant_val;
			if (val.IsNull()) {
				constant_val = is_offset ? 0 : NumericLimits<int64_t>::Maximum();
			} else {
				constant_val = val.GetValue<int64_t>();
			}
			if (constant_val < 0) {
				throw BinderException(expr->GetQueryLocation(), "LIMIT/OFFSET cannot be negative");
			}
			return BoundLimitNode::ConstantValue(constant_val);
		}
	}
	if (!new_binder->correlated_columns.empty()) {
		throw BinderException("Correlated columns not supported in LIMIT/OFFSET");
	}
	// move any correlated columns to this binder
	MoveCorrelatedExpressions(*new_binder);
	if (is_percentage) {
		return BoundLimitNode::ExpressionPercentage(std::move(expr));
	} else {
		return BoundLimitNode::ExpressionValue(std::move(expr));
	}
}